

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations::Print
          (ForwardDeclarations *this,Printer *p,Options *options)

{
  EnumDescriptor *desc_00;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  undefined1 desc_01 [8];
  bool bVar1;
  undefined1 uVar2;
  char *in_R8;
  const_iterator cVar3;
  const_iterator cVar4;
  Sub *local_ad0;
  Sub *local_a70;
  Sub *local_9f8;
  basic_string_view<char,_std::char_traits<char>_> local_9c8;
  undefined1 local_9b1;
  string local_9b0;
  allocator<char> local_989;
  string local_988;
  string local_968;
  allocator<char> local_941;
  string local_940;
  Sub *local_920;
  Sub local_918;
  Sub local_860;
  iterator local_7a8;
  size_type local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_798;
  undefined1 local_788 [8];
  Descriptor *desc_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  *s;
  undefined4 local_770;
  undefined1 local_768 [8];
  const_iterator __end3_2;
  undefined1 local_748 [8];
  const_iterator __begin3_2;
  btree_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  *__range3_2;
  basic_string_view<char,_std::char_traits<char>_> local_728;
  undefined1 local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_678;
  AnnotationRecord local_670;
  allocator<char> local_629;
  string local_628;
  Sub local_608;
  Sub *local_550;
  Sub local_548;
  Sub local_490;
  Sub local_3d8;
  iterator local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_310;
  undefined1 local_300 [8];
  Descriptor *desc;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
  *c;
  undefined4 local_2e8;
  undefined1 local_2e0 [8];
  const_iterator __end3_1;
  undefined1 local_2c0 [8];
  const_iterator __begin3_1;
  btree_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  *__range3_1;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  undefined1 local_28a;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_288;
  AnnotationRecord local_280;
  allocator<char> local_229;
  string local_228;
  Sub local_208;
  Sub *local_150;
  Sub local_148;
  iterator local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_80;
  undefined1 local_70 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>
  *e;
  undefined4 local_60;
  undefined1 local_58 [8];
  const_iterator __end3;
  undefined1 local_38 [8];
  const_iterator __begin3;
  btree_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>_>
  *__range3;
  Options *options_local;
  Printer *p_local;
  ForwardDeclarations *this_local;
  
  __begin3._8_8_ = &this->enums_;
  cVar3 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>_>
                   *)__begin3._8_8_);
  __end3._8_8_ = cVar3.node_;
  __begin3.node_._0_4_ = cVar3.position_;
  local_38 = (undefined1  [8])__end3._8_8_;
  cVar3 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>_>
                 *)__begin3._8_8_);
  e = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>
       *)cVar3.node_;
  local_60 = cVar3.position_;
  local_58 = (undefined1  [8])e;
  __end3.node_._0_4_ = local_60;
  while( true ) {
    bVar1 = absl::lts_20240722::container_internal::
            btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>
            ::operator!=((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>
                          *)local_38,(const_iterator *)local_58);
    if (!bVar1) break;
    local_70 = (undefined1  [8])
               absl::lts_20240722::container_internal::
               btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>
               ::operator*((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>
                            *)local_38);
    local_28a = 1;
    local_150 = &local_148;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"enum",&local_229);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              (&local_208,&local_228,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    desc_00 = *(EnumDescriptor **)((long)local_70 + 0x20);
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_288);
    io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::EnumDescriptor,_0>
              (&local_280,desc_00,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)
               local_288.
               super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
               ._M_payload.
               super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>);
    io::Printer::Sub::AnnotatedAs(&local_148,&local_208,&local_280);
    local_28a = 0;
    local_90 = &local_148;
    local_88 = 1;
    v_01._M_len = 1;
    v_01._M_array = local_90;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_80._M_local_buf,v_01);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a0,
               "\n        enum $enum$ : int;\n        bool $enum$_IsValid(int value);\n      ");
    io::Printer::SourceLocation::current();
    in_R8 = local_2a0._M_str;
    google::protobuf::io::Printer::Emit
              (p,local_80._M_allocated_capacity,local_80._8_8_,local_2a0._M_len);
    local_9f8 = (Sub *)&local_90;
    do {
      local_9f8 = local_9f8 + -1;
      io::Printer::Sub::~Sub(local_9f8);
    } while (local_9f8 != &local_148);
    io::Printer::AnnotationRecord::~AnnotationRecord(&local_280);
    io::Printer::Sub::~Sub(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    absl::lts_20240722::container_internal::
    btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>
    ::operator++((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumDescriptor_*>_*>
                  *)local_38);
  }
  __begin3_1._8_8_ = this;
  cVar4 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
                   *)this);
  __end3_1._8_8_ = cVar4.node_;
  __begin3_1.node_._0_4_ = cVar4.position_;
  local_2c0 = (undefined1  [8])__end3_1._8_8_;
  cVar4 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
                 *)__begin3_1._8_8_);
  c = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
       *)cVar4.node_;
  local_2e8 = cVar4.position_;
  local_2e0 = (undefined1  [8])c;
  __end3_1.node_._0_4_ = local_2e8;
  while( true ) {
    bVar1 = absl::lts_20240722::container_internal::
            btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
            ::operator!=((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
                          *)local_2c0,(const_iterator *)local_2e0);
    uVar2 = SUB81(in_R8,0);
    if (!bVar1) break;
    desc = (Descriptor *)
           absl::lts_20240722::container_internal::
           btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
           ::operator*((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
                        *)local_2c0);
    local_300 = (undefined1  [8])((reference)desc)->second;
    local_711 = 1;
    local_550 = &local_548;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"class",&local_629);
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              (&local_608,&local_628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)desc);
    desc_01 = local_300;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
              ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_678);
    io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::Descriptor,_0>
              (&local_670,(Descriptor *)desc_01,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_678);
    io::Printer::Sub::AnnotatedAs(&local_548,&local_608,&local_670);
    local_550 = &local_490;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"default_type",&local_6a1);
    DefaultInstanceType_abi_cxx11_
              (&local_6c8,(cpp *)local_300,(Descriptor *)options,(Options *)0x0,(bool)uVar2);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_490,&local_6a0,&local_6c8);
    local_550 = &local_3d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,"default_name",&local_6e9);
    DefaultInstanceName_abi_cxx11_
              (&local_710,(cpp *)local_300,(Descriptor *)options,(Options *)0x0,(bool)uVar2);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_3d8,&local_6e8,&local_710);
    local_711 = 0;
    local_320 = &local_548;
    local_318 = 3;
    v_00._M_len = 3;
    v_00._M_array = local_320;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_310._M_local_buf,v_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_728,
               "\n            class $class$;\n            struct $default_type$;\n            $dllexport_decl $extern $default_type$ $default_name$;\n          "
              );
    io::Printer::SourceLocation::current();
    in_R8 = local_728._M_str;
    google::protobuf::io::Printer::Emit
              (p,local_310._M_allocated_capacity,local_310._8_8_,local_728._M_len);
    local_a70 = (Sub *)&local_320;
    do {
      local_a70 = local_a70 + -1;
      io::Printer::Sub::~Sub(local_a70);
    } while (local_a70 != &local_548);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::allocator<char>::~allocator(&local_6a1);
    io::Printer::AnnotationRecord::~AnnotationRecord(&local_670);
    io::Printer::Sub::~Sub(&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    absl::lts_20240722::container_internal::
    btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
    ::operator++((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  *)local_2c0);
  }
  __begin3_2._8_8_ = &this->splits_;
  cVar4 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
          ::begin((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
                   *)__begin3_2._8_8_);
  __end3_2._8_8_ = cVar4.node_;
  __begin3_2.node_._0_4_ = cVar4.position_;
  local_748 = (undefined1  [8])__end3_2._8_8_;
  cVar4 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
          ::end((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_>
                 *)__begin3_2._8_8_);
  s = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>
       *)cVar4.node_;
  local_770 = cVar4.position_;
  local_768 = (undefined1  [8])s;
  __end3_2.node_._0_4_ = local_770;
  while( true ) {
    uVar2 = SUB81(in_R8,0);
    bVar1 = absl::lts_20240722::container_internal::
            btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
            ::operator!=((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
                          *)local_748,(const_iterator *)local_768);
    if (!bVar1) break;
    desc_1 = (Descriptor *)
             absl::lts_20240722::container_internal::
             btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
             ::operator*((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
                          *)local_748);
    local_788 = (undefined1  [8])((reference)desc_1)->second;
    local_9b1 = 1;
    local_920 = &local_918;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_940,"default_type",&local_941);
    DefaultInstanceType_abi_cxx11_
              (&local_968,(cpp *)local_788,(Descriptor *)options,(Options *)0x1,(bool)uVar2);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_918,&local_940,&local_968);
    local_920 = &local_860;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_988,"default_name",&local_989);
    DefaultInstanceName_abi_cxx11_
              (&local_9b0,(cpp *)local_788,(Descriptor *)options,(Options *)0x1,(bool)uVar2);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_860,&local_988,&local_9b0);
    local_9b1 = 0;
    local_7a8 = &local_918;
    local_7a0 = 2;
    v._M_len = 2;
    v._M_array = local_7a8;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_798._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_9c8,
               "\n            struct $default_type$;\n            $dllexport_decl $extern const $default_type$ $default_name$;\n          "
              );
    io::Printer::SourceLocation::current();
    in_R8 = local_9c8._M_str;
    google::protobuf::io::Printer::Emit
              (p,local_798._M_allocated_capacity,local_798._8_8_,local_9c8._M_len);
    local_ad0 = (Sub *)&local_7a8;
    do {
      local_ad0 = local_ad0 + -1;
      io::Printer::Sub::~Sub(local_ad0);
    } while (local_ad0 != &local_918);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator(&local_989);
    std::__cxx11::string::~string((string *)&local_968);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator(&local_941);
    absl::lts_20240722::container_internal::
    btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
    ::operator++((btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_*>
                  *)local_748);
  }
  return;
}

Assistant:

void Print(io::Printer* p, const Options& options) const {
    for (const auto& e : enums_) {
      p->Emit({Sub("enum", e.first).AnnotatedAs(e.second)}, R"cc(
        enum $enum$ : int;
        bool $enum$_IsValid(int value);
      )cc");
    }

    for (const auto& c : classes_) {
      const Descriptor* desc = c.second;
      p->Emit(
          {
              Sub("class", c.first).AnnotatedAs(desc),
              {"default_type", DefaultInstanceType(desc, options)},
              {"default_name", DefaultInstanceName(desc, options)},
          },
          R"cc(
            class $class$;
            struct $default_type$;
            $dllexport_decl $extern $default_type$ $default_name$;
          )cc");
    }

    for (const auto& s : splits_) {
      const Descriptor* desc = s.second;
      p->Emit(
          {
              {"default_type",
               DefaultInstanceType(desc, options, /*split=*/true)},
              {"default_name",
               DefaultInstanceName(desc, options, /*split=*/true)},
          },
          R"cc(
            struct $default_type$;
            $dllexport_decl $extern const $default_type$ $default_name$;
          )cc");
    }
  }